

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeVectorCompare(Parse *pParse,Expr *pExpr,int dest,u8 op,u8 p5)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char in_CL;
  long in_RSI;
  Parse *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  int r2;
  int r1;
  int isCommuted;
  int addrDone;
  int addrCmp;
  u8 opx;
  int regRight;
  int regLeft;
  int i;
  int nLeft;
  Expr *pRight;
  Expr *pLeft;
  Vdbe *v;
  Expr *pR;
  Expr *pL;
  int regFree2;
  int regFree1;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int opcode;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 uVar10;
  char cVar11;
  int local_58;
  Expr *pExpr_00;
  Expr *pExpr_01;
  Vdbe *p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI->pVdbe;
  pExpr_01 = *(Expr **)(in_RSI + 0x10);
  pExpr_00 = *(Expr **)(in_RSI + 0x18);
  iVar2 = sqlite3ExprVectorSize(pExpr_01);
  uVar10 = CONCAT13(in_CL,(int3)in_stack_ffffffffffffff9c);
  iVar9 = 0;
  iVar3 = sqlite3VdbeMakeLabel(in_RDI);
  uVar4 = (uint)((*(uint *)(in_RSI + 4) & 0x400) != 0);
  if (in_RDI->nErr == 0) {
    opcode = iVar2;
    iVar5 = sqlite3ExprVectorSize(pExpr_00);
    if (opcode == iVar5) {
      if (in_CL == '8') {
        uVar10 = CONCAT13(0x39,(int3)uVar10);
      }
      if (in_CL == ':') {
        uVar10 = CONCAT13(0x37,(int3)uVar10);
      }
      if (in_CL == '5') {
        uVar10 = CONCAT13(0x36,(int3)uVar10);
      }
      exprCodeSubselect((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (Expr *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      exprCodeSubselect((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (Expr *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
      local_58 = 0;
      while( true ) {
        uVar8 = 0xaaaaaaaa;
        uVar7 = 0xaaaaaaaa;
        if (iVar9 != 0) {
          sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c);
        }
        iVar5 = exprVectorRegister((Parse *)CONCAT44(uVar8,uVar7),
                                   (Expr *)CONCAT44(opcode,in_stack_ffffffffffffff80),
                                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                                   (Expr **)CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70),
                                   (int *)CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68));
        iVar6 = exprVectorRegister((Parse *)CONCAT44(iVar5,uVar7),
                                   (Expr *)CONCAT44(opcode,in_stack_ffffffffffffff80),
                                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                                   (Expr **)CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70),
                                   (int *)CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68));
        in_stack_ffffffffffffff78 = uVar4;
        in_stack_ffffffffffffff68 = iVar3;
        iVar9 = sqlite3VdbeCurrentAddr(p);
        in_stack_ffffffffffffff70 = (uint)in_R8B;
        uVar4 = in_stack_ffffffffffffff78;
        iVar3 = in_stack_ffffffffffffff68;
        codeCompare((Parse *)CONCAT44(uVar10,iVar9),
                    (Expr *)CONCAT44(in_stack_ffffffffffffff68,in_stack_ffffffffffffff78),
                    (Expr *)CONCAT44(iVar5,iVar6),opcode,in_stack_ffffffffffffff80,
                    in_stack_ffffffffffffff7c,(int)pExpr_00,(int)pExpr_01,(int)p);
        sqlite3ReleaseTempReg(in_RDI,0);
        sqlite3ReleaseTempReg(in_RDI,0);
        cVar11 = (char)((uint)uVar10 >> 0x18);
        if (((cVar11 == '9') || (cVar11 == '7')) && (local_58 < iVar2 + -1)) {
          iVar9 = sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        }
        if (in_R8B == 0x80) {
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
        }
        else {
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar5,iVar6),opcode,in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        }
        if (local_58 == iVar2 + -1) break;
        if ((char)((uint)uVar10 >> 0x18) == '6') {
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
        }
        else {
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
          if (local_58 == iVar2 + -2) {
            uVar10 = CONCAT13(in_CL,(int3)uVar10);
          }
        }
        local_58 = local_58 + 1;
      }
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
      sqlite3VdbeResolveLabel
                ((Vdbe *)CONCAT44(opcode,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c);
      if (in_CL == '5') {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
      }
    }
    else {
      sqlite3ErrorMsg(in_RDI,"row value misused");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void codeVectorCompare(
  Parse *pParse,        /* Code generator context */
  Expr *pExpr,          /* The comparison operation */
  int dest,             /* Write results into this register */
  u8 op,                /* Comparison operator */
  u8 p5                 /* SQLITE_NULLEQ or zero */
){
  Vdbe *v = pParse->pVdbe;
  Expr *pLeft = pExpr->pLeft;
  Expr *pRight = pExpr->pRight;
  int nLeft = sqlite3ExprVectorSize(pLeft);
  int i;
  int regLeft = 0;
  int regRight = 0;
  u8 opx = op;
  int addrCmp = 0;
  int addrDone = sqlite3VdbeMakeLabel(pParse);
  int isCommuted = ExprHasProperty(pExpr,EP_Commuted);

  assert( !ExprHasVVAProperty(pExpr,EP_Immutable) );
  if( pParse->nErr ) return;
  if( nLeft!=sqlite3ExprVectorSize(pRight) ){
    sqlite3ErrorMsg(pParse, "row value misused");
    return;
  }
  assert( pExpr->op==TK_EQ || pExpr->op==TK_NE
       || pExpr->op==TK_IS || pExpr->op==TK_ISNOT
       || pExpr->op==TK_LT || pExpr->op==TK_GT
       || pExpr->op==TK_LE || pExpr->op==TK_GE
  );
  assert( pExpr->op==op || (pExpr->op==TK_IS && op==TK_EQ)
            || (pExpr->op==TK_ISNOT && op==TK_NE) );
  assert( p5==0 || pExpr->op!=op );
  assert( p5==SQLITE_NULLEQ || pExpr->op==op );

  if( op==TK_LE ) opx = TK_LT;
  if( op==TK_GE ) opx = TK_GT;
  if( op==TK_NE ) opx = TK_EQ;

  regLeft = exprCodeSubselect(pParse, pLeft);
  regRight = exprCodeSubselect(pParse, pRight);

  sqlite3VdbeAddOp2(v, OP_Integer, 1, dest);
  for(i=0; 1 /*Loop exits by "break"*/; i++){
    int regFree1 = 0, regFree2 = 0;
    Expr *pL = 0, *pR = 0;
    int r1, r2;
    assert( i>=0 && i<nLeft );
    if( addrCmp ) sqlite3VdbeJumpHere(v, addrCmp);
    r1 = exprVectorRegister(pParse, pLeft, i, regLeft, &pL, &regFree1);
    r2 = exprVectorRegister(pParse, pRight, i, regRight, &pR, &regFree2);
    addrCmp = sqlite3VdbeCurrentAddr(v);
    codeCompare(pParse, pL, pR, opx, r1, r2, addrDone, p5, isCommuted);
    testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
    testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
    testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
    testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
    testcase(op==OP_Eq); VdbeCoverageIf(v,op==OP_Eq);
    testcase(op==OP_Ne); VdbeCoverageIf(v,op==OP_Ne);
    sqlite3ReleaseTempReg(pParse, regFree1);
    sqlite3ReleaseTempReg(pParse, regFree2);
    if( (opx==TK_LT || opx==TK_GT) && i<nLeft-1 ){
      addrCmp = sqlite3VdbeAddOp0(v, OP_ElseEq);
      testcase(opx==TK_LT); VdbeCoverageIf(v,opx==TK_LT);
      testcase(opx==TK_GT); VdbeCoverageIf(v,opx==TK_GT);
    }
    if( p5==SQLITE_NULLEQ ){
      sqlite3VdbeAddOp2(v, OP_Integer, 0, dest);
    }else{
      sqlite3VdbeAddOp3(v, OP_ZeroOrNull, r1, dest, r2);
    }
    if( i==nLeft-1 ){
      break;
    }
    if( opx==TK_EQ ){
      sqlite3VdbeAddOp2(v, OP_NotNull, dest, addrDone); VdbeCoverage(v);
    }else{
      assert( op==TK_LT || op==TK_GT || op==TK_LE || op==TK_GE );
      sqlite3VdbeAddOp2(v, OP_Goto, 0, addrDone);
      if( i==nLeft-2 ) opx = op;
    }
  }
  sqlite3VdbeJumpHere(v, addrCmp);
  sqlite3VdbeResolveLabel(v, addrDone);
  if( op==TK_NE ){
    sqlite3VdbeAddOp2(v, OP_Not, dest, dest);
  }
}